

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.c
# Opt level: O1

void print_exponential_number
               (output_gadget_t *output,floating_point_t number,printf_size_t precision,
               printf_size_t width,printf_flags_t flags,char *buf,printf_size_t len)

{
  double dVar1;
  floating_point_components number_;
  printf_size_t pVar2;
  byte bVar3;
  uint uVar4;
  printf_size_t width_00;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  printf_unsigned_value_t pVar10;
  printf_size_t pVar11;
  printf_size_t precision_00;
  ulong uVar12;
  bool bVar13;
  double dVar14;
  floating_point_t number_00;
  ulong in_XMM0_Qb;
  floating_point_t in_XMM1_Qa;
  double dVar15;
  double dVar16;
  floating_point_components local_80;
  printf_size_t local_68;
  printf_size_t local_64;
  char *local_60;
  floating_point_t local_58;
  ulong uStack_50;
  floating_point_t local_48;
  
  local_58 = ABS(number);
  uStack_50 = in_XMM0_Qb & 0x7fffffffffffffff;
  if ((number != 0.0) || (NAN(number))) {
    dVar14 = (double)((ulong)number & 0xfffffffffffff | 0x3ff0000000000000) + -1.5;
    dVar14 = (double)(int)((uint)((ulong)local_58 >> 0x34) - 0x3ff) * 0.3010299956639812 +
             dVar14 * dVar14 * dVar14 * 0.042893282163284134 +
             dVar14 * dVar14 * -0.09650988486738929 +
             dVar14 * 0.2895296546021679 + 0.17609125905568124;
    iVar6 = (int)dVar14 - (uint)(dVar14 < 0.0 && (double)(int)dVar14 != dVar14);
    if (iVar6 == -0x134) {
      in_XMM1_Qa = 1e-308;
    }
    else {
      dVar14 = (double)iVar6 * 3.321928094887362 + 0.5;
      uVar8 = (int)dVar14 - (uint)((double)(int)dVar14 != dVar14 && dVar14 < 0.0);
      dVar14 = (double)iVar6 * 2.302585092994046 + (double)(int)uVar8 * -0.6931471805599453;
      dVar16 = dVar14 * dVar14;
      in_XMM1_Qa = (double)(((ulong)uVar8 << 0x34) + 0x3ff0000000000000) *
                   ((dVar14 + dVar14) /
                    (dVar16 / (dVar16 / (dVar16 / 14.0 + 10.0) + 6.0) + (2.0 - dVar14)) + 1.0);
    }
    bVar13 = local_58 < in_XMM1_Qa;
    if (local_58 < in_XMM1_Qa) {
      in_XMM1_Qa = in_XMM1_Qa / 10.0;
    }
    uVar7 = iVar6 - (uint)bVar13;
    uVar8 = -uVar7;
    if (0 < (int)uVar7) {
      uVar8 = uVar7;
    }
    pVar11 = (printf_size_t)(uVar8 < 0x11);
    if (uVar8 < 0x11) {
      in_XMM1_Qa = powers_of_10[uVar8];
      pVar11 = 1;
    }
  }
  else {
    uVar7 = 0;
    pVar11 = width;
  }
  uVar12 = (ulong)(precision - 1);
  if (precision == 0) {
    uVar12 = 0;
  }
  if ((flags & 0x1000) == 0) {
    uVar12 = (ulong)precision;
  }
  precision_00 = (printf_size_t)uVar12;
  local_68 = len;
  local_64 = width;
  local_60 = buf;
  local_48 = number;
  if (uVar7 == 0) {
    dVar14 = number;
    if ((long)number < 0) {
      dVar14 = -local_58;
    }
  }
  else {
    bVar3 = (byte)pVar11 & (int)uVar7 < 0;
    if (bVar3 == 0) {
      dVar14 = local_58 / in_XMM1_Qa;
    }
    else {
      dVar14 = local_58 * in_XMM1_Qa;
    }
    if ((int)(precision_00 - uVar7) < 0x133) {
      dVar16 = (double)(long)dVar14;
      if (bVar3 == 0) {
        dVar16 = dVar16 * in_XMM1_Qa;
      }
      else {
        dVar16 = dVar16 / in_XMM1_Qa;
      }
      dVar1 = powers_of_10[uVar12];
      if (bVar3 == 0) {
        uVar4 = ((uint)((ulong)in_XMM1_Qa >> 0x34) & 0x7ff) - 0x3ff;
        uVar9 = ((uint)((ulong)dVar1 >> 0x34) & 0x7ff) - 0x3ff;
        uVar8 = -uVar4;
        if (0 < (int)uVar4) {
          uVar8 = uVar4;
        }
        uVar4 = -uVar9;
        if (0 < (int)uVar9) {
          uVar4 = uVar9;
        }
        bVar13 = uVar8 <= uVar4;
        if (uVar4 < uVar8) {
          dVar15 = in_XMM1_Qa / dVar1;
        }
        else {
          dVar15 = dVar1 / in_XMM1_Qa;
        }
      }
      else {
        dVar15 = in_XMM1_Qa * dVar1;
        bVar13 = true;
      }
      if (bVar13) {
        dVar15 = (local_58 - dVar16) * dVar15;
      }
      else {
        dVar15 = (local_58 - dVar16) / dVar15;
      }
      dVar16 = dVar15 - (double)(long)dVar15;
      uVar5 = ((long)dVar15 + 1) - (ulong)(dVar16 < 0.5);
      uVar12 = uVar5 & 0xfffffffffffffffe;
      if (dVar16 != 0.5) {
        uVar12 = uVar5;
      }
      if (NAN(dVar16)) {
        uVar12 = uVar5;
      }
      local_80.integral = ((long)dVar14 + 1) - (ulong)((double)(long)uVar12 < dVar1);
      local_80.fractional = 0;
      if ((double)(long)uVar12 < dVar1) {
        local_80.fractional = uVar12;
      }
      local_80.is_negative = SUB81((ulong)number >> 0x3f,0);
      goto LAB_00103b24;
    }
    if ((long)number < 0) {
      dVar14 = -dVar14;
    }
  }
  get_components(&local_80,dVar14,precision_00);
LAB_00103b24:
  uVar8 = uVar7;
  if (9 < local_80.integral) {
    uVar8 = uVar7 + 1;
    local_80.integral = 1;
    local_80.fractional = 0;
  }
  pVar10 = (printf_unsigned_value_t)uVar8;
  bVar3 = -5 < (int)uVar8 & (byte)(flags >> 0xc) & (int)uVar8 <= (int)precision_00;
  if (bVar3 == 1) {
    pVar11 = precision_00 - uVar8;
    bVar13 = (int)precision_00 < (int)uVar8;
    precision_00 = pVar11;
    if (pVar11 == 0 || bVar13) {
      precision_00 = 0;
    }
    number_00 = local_48;
    if ((long)number < 0) {
      number_00 = -local_58;
    }
    get_components(&local_80,number_00,precision_00);
    if ((int)uVar7 < -1) {
      pVar10 = (printf_unsigned_value_t)uVar7;
    }
    else {
      pVar10 = (printf_unsigned_value_t)(uVar7 + 1);
      if ((powers_of_10[pVar10] != (double)local_80.integral) ||
         (NAN(powers_of_10[pVar10]) || NAN((double)local_80.integral))) {
        pVar10 = (printf_unsigned_value_t)uVar7;
      }
      else {
        bVar13 = precision_00 == 0;
        precision_00 = precision_00 - 1;
        if (bVar13) {
          precision_00 = 0;
        }
      }
    }
  }
  pVar11 = local_64;
  uVar8 = 0;
  uVar7 = (uint)pVar10;
  if (bVar3 == 0) {
    uVar8 = -uVar7;
    if (0 < (int)uVar7) {
      uVar8 = uVar7;
    }
    uVar8 = 5 - (uVar8 < 100);
  }
  pVar2 = local_64 - uVar8;
  if (local_64 < uVar8) {
    pVar2 = 0;
  }
  width_00 = 0;
  if (uVar8 == 0) {
    width_00 = pVar2;
  }
  if ((flags & 2) == 0) {
    width_00 = pVar2;
  }
  pVar2 = output->pos;
  number_._17_7_ = local_80._17_7_;
  number_.is_negative = local_80.is_negative;
  number_.fractional = local_80.fractional;
  number_.integral = local_80.integral;
  print_broken_up_decimal
            (number_,output,precision_00,width_00,(flags & 0x1000) >> 1 | flags,local_60,local_68);
  if (bVar3 == 0) {
    uVar4 = output->pos;
    output->pos = uVar4 + 1;
    if (uVar4 < output->max_chars) {
      bVar3 = (byte)flags & 0x20 ^ 0x65;
      if (output->function == (_func_void_char_void_ptr *)0x0) {
        output->buffer[uVar4] = bVar3;
      }
      else {
        (*output->function)(bVar3,output->extra_function_arg);
      }
    }
    uVar12 = (ulong)-uVar7;
    if (0 < (int)uVar7) {
      uVar12 = pVar10;
    }
    print_integer(output,uVar12,(_Bool)((byte)(pVar10 >> 0x18) >> 7),'\n',0,uVar8 - 1,5);
    if ((flags & 2) != 0) {
      while (uVar8 = output->pos, uVar8 - pVar2 < pVar11) {
        output->pos = uVar8 + 1;
        if (uVar8 < output->max_chars) {
          if (output->function == (_func_void_char_void_ptr *)0x0) {
            output->buffer[uVar8] = ' ';
          }
          else {
            (*output->function)(' ',output->extra_function_arg);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void print_exponential_number(output_gadget_t* output, floating_point_t number, printf_size_t precision, printf_size_t width, printf_flags_t flags, char* buf, printf_size_t len)
{
  const bool negative = get_sign_bit(number);
  // This number will decrease gradually (by factors of 10) as we "extract" the exponent out of it
  floating_point_t abs_number =  SIGN(negative, number);

  int floored_exp10;
  bool abs_exp10_covered_by_powers_table;
  struct scaling_factor normalization;


  // Determine the decimal exponent
  if (abs_number == (floating_point_t) 0.0) {
    // TODO: This is a special-case for 0.0 (and -0.0); but proper handling is required for denormals more generally.
    floored_exp10 = 0; // ... and no need to set a normalization factor or check the powers table
  }
  else  {
    floating_point_t exp10 = log10_of_positive(abs_number);
    floored_exp10 = bastardized_floor(exp10);
    floating_point_t p10 = pow10_of_int(floored_exp10);
    // correct for rounding errors
    if (abs_number < p10) {
      floored_exp10--;
      p10 /= 10;
    }
    abs_exp10_covered_by_powers_table = PRINTF_ABS(floored_exp10) < PRINTF_MAX_PRECOMPUTED_POWER_OF_10;
    normalization.raw_factor = abs_exp10_covered_by_powers_table ? powers_of_10[PRINTF_ABS(floored_exp10)] : p10;
  }

  if (flags & FLAGS_ADAPT_EXP) {
    // Note: For now, still assuming we _don't_ fall-back to "%f" mode; we can't decide
    // that until we've established the exact exponent.

    // In "%g" mode, "precision" is the number of _significant digits_; we must
    // "translate" that  to an actual number of decimal digits.
    precision = (precision > 1) ? (precision - 1U) : 0U;
    flags |= FLAGS_PRECISION;   // make sure print_broken_up_decimal respects our choice
  }

  // We now begin accounting for the widths of the two parts of our printed field:
  // the decimal part after decimal exponent extraction, and the base-10 exponent part.
  // For both of these, the value of 0 has a special meaning, but not the same one:
  // a 0 exponent-part width means "don't print the exponent"; a 0 decimal-part width
  // means "use as many characters as necessary".

  normalization.multiply = (floored_exp10 < 0 && abs_exp10_covered_by_powers_table);
  struct floating_point_components decimal_part_components =
    (floored_exp10 == 0) ?
    get_components(SIGN(negative, abs_number), precision) :
    get_normalized_components(negative, precision, abs_number, normalization, floored_exp10);

  // Account for roll-over, e.g. rounding from 9.99 to 100.0 - which effects
  // the exponent and may require additional tweaking of the parts
  // (and saving the floored_exp10 in case we'll need to undo the roll-over).
  int original_floored_exp10 = floored_exp10;
  if (decimal_part_components.integral >= 10) {
    floored_exp10++;
    decimal_part_components.integral = 1;
    decimal_part_components.fractional = 0;
  }

  // Should we want to fall-back to "%f" mode, and only print the decimal part?
  // (and remember we have decreased "precision" by 1
  bool fall_back_to_decimal_only_mode = (flags & FLAGS_ADAPT_EXP) && (floored_exp10 >= -4) && (floored_exp10 < (int) precision + 1);

  if (fall_back_to_decimal_only_mode) {
      precision = ((int) precision > floored_exp10) ? (unsigned) ((int) precision - floored_exp10) : 0U;
    // Redo some work :-)
    floored_exp10 = original_floored_exp10;
    decimal_part_components = get_components(SIGN(negative, abs_number), precision);

    if ((flags & FLAGS_ADAPT_EXP) && floored_exp10 >= -1 && ((double)decimal_part_components.integral == powers_of_10[floored_exp10 + 1])) {
      floored_exp10++; // Not strictly necessary, since floored_exp10 is no longer really used
      if (precision > 0U) { precision--; }
      // ... and it should already be the case that decimal_part_components.fractional == 0
    }
    // TODO: What about rollover strictly within the fractional part?
  }

  // the floored_exp10 format is "E%+03d" and largest possible floored_exp10 value for a 64-bit double
  // is "307" (for 2^1023), so we set aside 4-5 characters overall
  printf_size_t exp10_part_width = fall_back_to_decimal_only_mode ? 0U : (PRINTF_ABS(floored_exp10) < 100) ? 4U : 5U;

  printf_size_t decimal_part_width =
    ((flags & FLAGS_LEFT) && exp10_part_width) ?
      // We're padding on the right, so the width constraint is the exponent part's
      // problem, not the decimal part's, so we'll use as many characters as we need:
      0U :
      // We're padding on the left; so the width constraint is the decimal part's
      // problem. Well, can both the decimal part and the exponent part fit within our overall width?
      ((width > exp10_part_width) ?
        // Yes, so we limit our decimal part's width.
        // (Note this is trivially valid even if we've fallen back to "%f" mode)
        width - exp10_part_width :
        // No; we just give up on any restriction on the decimal part and use as many
        // characters as we need
        0U);

  const printf_size_t printed_exponential_start_pos = output->pos;
  print_broken_up_decimal(decimal_part_components, output, precision, decimal_part_width, flags, buf, len);

  if (! fall_back_to_decimal_only_mode) {
    putchar_via_gadget(output, (flags & FLAGS_UPPERCASE) ? 'E' : 'e');
    print_integer(output,
                  ABS_FOR_PRINTING(floored_exp10),
                  floored_exp10 < 0, 10, 0, exp10_part_width - 1,
                FLAGS_ZEROPAD | FLAGS_PLUS);
    if (flags & FLAGS_LEFT) {
      // We need to right-pad with spaces to meet the width requirement
      while (output->pos - printed_exponential_start_pos < width) {
        putchar_via_gadget(output, ' ');
      }
    }
  }
}